

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O0

size_t ngx_utf8_length(u_char *p,size_t n)

{
  uint32_t uVar1;
  size_t local_38;
  size_t len;
  u_char *last;
  u_char c;
  size_t n_local;
  u_char *p_local;
  
  local_38 = 0;
  n_local = (size_t)p;
  do {
    if (p + n <= n_local) {
      return local_38;
    }
    if (*(byte *)n_local < 0x80) {
      n_local = n_local + 1;
    }
    else {
      uVar1 = ngx_utf8_decode((u_char **)&n_local,n);
      if (0x10ffff < uVar1) {
        return n;
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

size_t
ngx_utf8_length(u_char *p, size_t n)
{
    u_char  c, *last;
    size_t  len;

    last = p + n;

    for (len = 0; p < last; len++) {

        c = *p;

        if (c < 0x80) {
            p++;
            continue;
        }

        if (ngx_utf8_decode(&p, n) > 0x10ffff) {
            /* invalid UTF-8 */
            return n;
        }
    }

    return len;
}